

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

void pzshape::TPZShapeQuad::TransformPoint2dQ
               (int transid,TPZVec<Fad<double>_> *in,TPZVec<Fad<double>_> *out)

{
  Fad<double> *e;
  Fad<double> *this;
  Fad<double> *fadexpr;
  TPZVec<Fad<double>_> *in_RDX;
  TPZVec<Fad<double>_> *in_RSI;
  int in_EDI;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffffef0;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *this_00;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffff08;
  undefined1 *w;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *v;
  Fad<double> *in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff38;
  
  w = gTrans2dQ;
  TPZVec<Fad<double>_>::operator[](in_RSI,0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  v = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
      (((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)((long)w + (long)in_EDI * 0x20))->
      fadexpr_).left_.constant_;
  e = TPZVec<Fad<double>_>::operator[](in_RSI,1);
  operator*<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff38,e);
  operator+<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (v,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)w);
  this = TPZVec<Fad<double>_>::operator[](in_RDX,0);
  Fad<double>::operator=(this,in_stack_ffffffffffffff08);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffffef0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffffef0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffffef0);
  this_00 = *(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> **)
             (gTrans2dQ + (long)in_EDI * 0x20 + 0x10);
  TPZVec<Fad<double>_>::operator[](in_RSI,0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff38,e);
  fadexpr = TPZVec<Fad<double>_>::operator[](in_RSI,1);
  operator*<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff38,e);
  operator+<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (v,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)w);
  TPZVec<Fad<double>_>::operator[](in_RDX,1);
  Fad<double>::operator=
            (this,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                   *)fadexpr);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)this_00);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(this_00);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(this_00);
  return;
}

Assistant:

void TPZShapeQuad::TransformPoint2dQ(int transid, TPZVec<FADREAL> &in, TPZVec<FADREAL> &out) {
		
		out[0] = gTrans2dQ[transid][0][0]*in[0]+gTrans2dQ[transid][0][1]*in[1];//Cedric 23/02/99
		out[1] = gTrans2dQ[transid][1][0]*in[0]+gTrans2dQ[transid][1][1]*in[1];//Cedric 23/02/99
	}